

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateVariableAccess
          (ExpressionContext *ctx,SynBase *source,IntrusiveList<SynIdentifier> path,InplaceStr name,
          bool allowInternal)

{
  FunctionLookupChain chain;
  InplaceStr name_00;
  SynBase *pSVar1;
  SynBase *ctx_00;
  bool bVar2;
  uint nameHash;
  ScopeData *pSVar3;
  ExprBase *pEVar4;
  TypeBase *pTVar5;
  SynIdentifier *this;
  bool_type bVar6;
  FunctionData *pFVar7;
  uint local_164;
  uint local_134;
  FunctionLookupChain local_118;
  FunctionLookupChain local_100;
  SynIdentifier *local_e8;
  SynIdentifier *part_2;
  ScopeData *pSStack_d8;
  uint hash_2;
  ScopeData *nsScope_1;
  FunctionLookupChain function;
  ExprBase *member;
  VariableData *local_90;
  VariableData *variable_2;
  ConstantData *curr;
  TypeStruct *structType;
  VariableData *variable_1;
  SynIdentifier *part_1;
  ScopeData *pSStack_60;
  uint hash_1;
  ScopeData *nsScope;
  VariableData *variable;
  SynIdentifier *part;
  uint hash;
  bool allowInternal_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  IntrusiveList<SynIdentifier> path_local;
  
  name_local.begin = name.end;
  ctx_local = (ExpressionContext *)name.begin;
  name_local.end = (char *)path.head;
  part._7_1_ = allowInternal;
  _hash = source;
  source_local = (SynBase *)ctx;
  part._0_4_ = NULLC::GetStringHash("");
  for (variable = (VariableData *)name_local.end; variable != (VariableData *)0x0;
      variable = (VariableData *)getType<SynIdentifier>(*(SynBase **)&variable->nameHash)) {
    part._0_4_ = NULLC::StringHashContinue
                           ((uint)part,*(char **)&variable->uniqueId,(char *)(variable->users).data)
    ;
    part._0_4_ = NULLC::StringHashContinue((uint)part,".");
  }
  part._0_4_ = NULLC::StringHashContinue((uint)part,(char *)ctx_local,name_local.begin);
  nsScope = (ScopeData *)
            anon_unknown.dwarf_8df1c::LookupVariableByName
                      ((ExpressionContext *)source_local,(uint)part);
  if ((nsScope == (ScopeData *)0x0) ||
     (pSVar3 = anon_unknown.dwarf_8df1c::NamedOrGlobalScopeFrom
                         ((ScopeData *)nsScope->ownerNamespace),
     pSVar3 == (ScopeData *)source_local[0x205].pos.end)) {
    for (pSStack_60 = anon_unknown.dwarf_8df1c::NamedOrGlobalScopeFrom
                                ((ScopeData *)source_local[0x205].end);
        pSStack_60 != (ScopeData *)0x0;
        pSStack_60 = anon_unknown.dwarf_8df1c::NamedOrGlobalScopeFrom(pSStack_60->scope)) {
      if (pSStack_60->ownerNamespace == (NamespaceData *)0x0) {
        local_134 = NULLC::GetStringHash("");
      }
      else {
        local_134 = NULLC::StringHashContinue(pSStack_60->ownerNamespace->fullNameHash,".");
      }
      part_1._4_4_ = local_134;
      for (variable_1 = (VariableData *)name_local.end; variable_1 != (VariableData *)0x0;
          variable_1 = (VariableData *)getType<SynIdentifier>(*(SynBase **)&variable_1->nameHash)) {
        part_1._4_4_ = NULLC::StringHashContinue
                                 (part_1._4_4_,*(char **)&variable_1->uniqueId,
                                  (char *)(variable_1->users).data);
        part_1._4_4_ = NULLC::StringHashContinue(part_1._4_4_,".");
      }
      part_1._4_4_ = NULLC::StringHashContinue(part_1._4_4_,(char *)ctx_local,name_local.begin);
      structType = (TypeStruct *)
                   anon_unknown.dwarf_8df1c::LookupVariableByName
                             ((ExpressionContext *)source_local,part_1._4_4_);
      if ((VariableData *)structType != (VariableData *)0x0) {
        pEVar4 = CreateVariableAccess
                           ((ExpressionContext *)source_local,_hash,(VariableData *)structType,true)
        ;
        return pEVar4;
      }
    }
    pTVar5 = ExpressionContext::GetCurrentType
                       ((ExpressionContext *)source_local,(ScopeData *)source_local[0x205].end);
    curr = (ConstantData *)getType<TypeStruct>(pTVar5);
    if ((TypeStruct *)curr != (TypeStruct *)0x0) {
      for (variable_2 = (VariableData *)(((TypeStruct *)curr)->constants).head;
          variable_2 != (VariableData *)0x0; variable_2 = (VariableData *)variable_2->scope) {
        bVar2 = InplaceStr::operator==
                          ((InplaceStr *)(variable_2->source + 1),(InplaceStr *)&ctx_local);
        if (bVar2) {
          pEVar4 = CreateLiteralCopy((ExpressionContext *)source_local,_hash,
                                     (ExprBase *)variable_2->importModule);
          return pEVar4;
        }
      }
    }
    bVar2 = IntrusiveList<SynIdentifier>::empty((IntrusiveList<SynIdentifier> *)&name_local.end);
    if ((bVar2) &&
       (pTVar5 = anon_unknown.dwarf_8df1c::FindNextTypeFromScope
                           ((ScopeData *)source_local[0x205].end), pSVar1 = source_local,
       pTVar5 != (TypeBase *)0x0)) {
      InplaceStr::InplaceStr((InplaceStr *)&member,"this");
      nameHash = InplaceStr::hash((InplaceStr *)&member);
      local_90 = anon_unknown.dwarf_8df1c::LookupVariableByName
                           ((ExpressionContext *)pSVar1,nameHash);
      ctx_00 = source_local;
      pSVar1 = _hash;
      if (local_90 != (VariableData *)0x0) {
        pEVar4 = CreateVariableAccess((ExpressionContext *)source_local,_hash,local_90,true);
        this = ExpressionContext::get<SynIdentifier>((ExpressionContext *)source_local);
        function.scope = (ScopeData *)ctx_local;
        name_00.end = name_local.begin;
        name_00.begin = (char *)ctx_local;
        SynIdentifier::SynIdentifier(this,name_00);
        pEVar4 = CreateMemberAccess((ExpressionContext *)ctx_00,pSVar1,pEVar4,this,true);
        if (pEVar4 != (ExprBase *)0x0) {
          return pEVar4;
        }
      }
    }
    anon_unknown.dwarf_8df1c::FunctionLookupChain::FunctionLookupChain
              ((FunctionLookupChain *)&nsScope_1);
    for (pSStack_d8 = anon_unknown.dwarf_8df1c::NamedOrGlobalScopeFrom
                                ((ScopeData *)source_local[0x205].end);
        pSStack_d8 != (ScopeData *)0x0;
        pSStack_d8 = anon_unknown.dwarf_8df1c::NamedOrGlobalScopeFrom(pSStack_d8->scope)) {
      if (pSStack_d8->ownerNamespace == (NamespaceData *)0x0) {
        local_164 = NULLC::GetStringHash("");
      }
      else {
        local_164 = NULLC::StringHashContinue(pSStack_d8->ownerNamespace->fullNameHash,".");
      }
      part_2._4_4_ = local_164;
      for (local_e8 = (SynIdentifier *)name_local.end; local_e8 != (SynIdentifier *)0x0;
          local_e8 = getType<SynIdentifier>((local_e8->super_SynBase).next)) {
        part_2._4_4_ = NULLC::StringHashContinue
                                 (part_2._4_4_,(local_e8->name).begin,(local_e8->name).end);
        part_2._4_4_ = NULLC::StringHashContinue(part_2._4_4_,".");
      }
      part_2._4_4_ = NULLC::StringHashContinue(part_2._4_4_,(char *)ctx_local,name_local.begin);
      anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                (&local_100,(ExpressionContext *)source_local,part_2._4_4_);
      nsScope_1 = (ScopeData *)local_100.node.start;
      function.node.start = local_100.node.node;
      function.node.node = (Node *)local_100.scope;
      bVar6 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                        ((FunctionLookupChain *)&nsScope_1);
      if (bVar6 != 0) {
        pFVar7 = anon_unknown.dwarf_8df1c::FunctionLookupChain::operator->
                           ((FunctionLookupChain *)&nsScope_1);
        if (((pFVar7->isInternal & 1U) != 0) && ((part._7_1_ & 1) == 0)) {
          anon_unknown.dwarf_8df1c::FunctionLookupChain::FunctionLookupChain(&local_118);
          nsScope_1 = (ScopeData *)local_118.node.start;
          function.node.start = local_118.node.node;
          function.node.node = (Node *)local_118.scope;
        }
        break;
      }
    }
    bVar6 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                      ((FunctionLookupChain *)&nsScope_1);
    if (bVar6 == 0) {
      path_local.tail = (SynIdentifier *)0x0;
    }
    else {
      chain.node.node = function.node.start;
      chain.node.start = (Node *)nsScope_1;
      chain.scope = (ScopeData *)function.node.node;
      path_local.tail =
           (SynIdentifier *)
           CreateFunctionAccess((ExpressionContext *)source_local,_hash,chain,(ExprBase *)0x0);
    }
  }
  else {
    path_local.tail =
         (SynIdentifier *)
         CreateVariableAccess((ExpressionContext *)source_local,_hash,(VariableData *)nsScope,true);
  }
  return (ExprBase *)path_local.tail;
}

Assistant:

ExprBase* CreateVariableAccess(ExpressionContext &ctx, SynBase *source, IntrusiveList<SynIdentifier> path, InplaceStr name, bool allowInternal)
{
	// Check local scope first
	{
		unsigned hash = NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
		{
			// Must be non-global scope
			if(NamedOrGlobalScopeFrom(variable->scope) != ctx.globalScope)
				return CreateVariableAccess(ctx, source, variable, true);
		}
	}

	// Search for variable starting from current namespace to global scope
	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(VariableData *variable = LookupVariableByName(ctx, hash))
			return CreateVariableAccess(ctx, source, variable, true);
	}

	{
		// Try a class constant or an alias
		if(TypeStruct *structType = getType<TypeStruct>(ctx.GetCurrentType(ctx.scope)))
		{
			for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
			{
				if(curr->name->name == name)
					return CreateLiteralCopy(ctx, source, curr->value);
			}
		}
	}

	if(path.empty())
	{
		if(FindNextTypeFromScope(ctx.scope))
		{
			if(VariableData *variable = LookupVariableByName(ctx, InplaceStr("this").hash()))
			{
				if(ExprBase *member = CreateMemberAccess(ctx, source, CreateVariableAccess(ctx, source, variable, true), new (ctx.get<SynIdentifier>()) SynIdentifier(name), true))
					return member;
			}
		}
	}

	FunctionLookupChain function;

	for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
	{
		unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

		for(SynIdentifier *part = path.head; part; part = getType<SynIdentifier>(part->next))
		{
			hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
			hash = NULLC::StringHashContinue(hash, ".");
		}

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		function = LookupFunctionChainByName(ctx, hash);

		if(function)
		{
			if(function->isInternal && !allowInternal)
				function = FunctionLookupChain();

			break;
		}
	}

	if(function)
		return CreateFunctionAccess(ctx, source, function, NULL);

	return NULL;
}